

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

Value __thiscall
flexbuffers::Builder::CreateVector
          (Builder *this,size_t start,size_t vec_len,size_t step,bool typed,bool fixed,Value *keys)

{
  byte byte_width;
  BitWidth BVar1;
  Type TVar2;
  pointer pVVar3;
  BitWidth alignment;
  pointer pVVar4;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  long lVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  Value VVar9;
  long lStack_70;
  uint8_t local_65;
  Type local_64;
  undefined4 local_60;
  undefined4 local_5c;
  pointer local_58;
  size_t local_50;
  size_t local_48;
  pointer local_40;
  size_t local_38;
  
  local_5c = CONCAT31(in_register_00000089,fixed);
  local_60 = CONCAT31(in_register_00000081,typed);
  local_50 = step;
  if (fixed && !typed) {
    __assert_fail("!fixed || typed",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                  ,0x64a,
                  "Value flexbuffers::Builder::CreateVector(size_t, size_t, size_t, bool, bool, const Value *)"
                 );
  }
  alignment = BIT_WIDTH_8;
  if (0xff < vec_len) {
    if (vec_len < 0x10000) {
      alignment = BIT_WIDTH_16;
    }
    else {
      alignment = BIT_WIDTH_64 - (vec_len >> 0x20 == 0);
    }
  }
  if ((int)alignment < (int)this->force_min_bit_width_) {
    alignment = this->force_min_bit_width_;
  }
  local_38 = vec_len;
  if (keys == (Value *)0x0) {
    lStack_70 = 1;
  }
  else {
    BVar1 = Value::ElemWidth(keys,(long)(this->buf_).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->buf_).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,0);
    if ((int)alignment <= (int)BVar1) {
      alignment = BVar1;
    }
    lStack_70 = 3;
  }
  lVar6 = start << 4;
  lVar5 = local_50 * 0x10;
  local_64 = FBT_KEY;
  lVar8 = 0;
  local_58 = (pointer)lVar6;
  local_48 = start;
  while( true ) {
    pVVar4 = (this->stack_).
             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->stack_).
                      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 4) <=
        local_48 + lVar8) break;
    BVar1 = Value::ElemWidth((Value *)((long)&pVVar4->field_0 + lVar6),
                             (long)(this->buf_).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->buf_).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,lStack_70 + lVar8);
    if ((int)alignment <= (int)BVar1) {
      alignment = BVar1;
    }
    if ((char)local_60 != '\0') {
      pVVar4 = (this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (lVar8 == 0) {
        local_64 = *(Type *)((long)&pVVar4->type_ + (long)local_58);
      }
      else if (local_64 != *(Type *)((long)&pVVar4->type_ + lVar6)) {
        __assert_fail("vector_type == stack_[i].type_",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                      ,0x660,
                      "Value flexbuffers::Builder::CreateVector(size_t, size_t, size_t, bool, bool, const Value *)"
                     );
      }
    }
    lVar8 = lVar8 + local_50;
    lVar6 = lVar6 + lVar5;
  }
  if (((char)local_60 != '\0') &&
     ((FBT_BOOL < local_64 ||
      ((0x400003eU >> (local_64 & (FBT_VECTOR_FLOAT4|FBT_INDIRECT_UINT)) & 1) == 0)))) {
    __assert_fail("!typed || IsTypedVectorElementType(vector_type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                  ,0x666,
                  "Value flexbuffers::Builder::CreateVector(size_t, size_t, size_t, bool, bool, const Value *)"
                 );
  }
  byte_width = Align(this,alignment);
  sVar7 = local_48;
  if (keys != (Value *)0x0) {
    WriteOffset(this,(keys->field_0).u_,byte_width);
    Write<unsigned_long>(this,1L << ((char)keys->min_bit_width_ & 0x3f),(ulong)byte_width);
  }
  if ((char)local_5c == '\0') {
    Write<unsigned_long>(this,local_38,(ulong)byte_width);
  }
  local_40 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_58 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  lVar6 = sVar7 << 4;
  while( true ) {
    pVVar4 = (this->stack_).
             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar3 = (this->stack_).
             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pVVar3 - (long)pVVar4 >> 4) <= sVar7) break;
    WriteAny(this,(Value *)((long)&pVVar4->field_0 + lVar6),byte_width);
    sVar7 = sVar7 + local_50;
    lVar6 = lVar6 + lVar5;
  }
  if ((char)local_60 == '\0') {
    lVar6 = local_48 << 4;
    for (sVar7 = local_48; sVar7 < (ulong)((long)pVVar3 - (long)pVVar4 >> 4);
        sVar7 = sVar7 + local_50) {
      local_65 = Value::StoredPackedType((Value *)((long)&pVVar4->field_0 + lVar6),alignment);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->buf_,&local_65);
      pVVar4 = (this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar3 = (this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = lVar6 + lVar5;
    }
  }
  if (((byte)local_60 & keys == (Value *)0x0) == 1) {
    sVar7 = 0;
    if ((char)local_5c != '\0') {
      sVar7 = local_38;
    }
    TVar2 = ToTypedVector(local_64,sVar7);
  }
  else {
    TVar2 = (keys == (Value *)0x0) + FBT_MAP;
  }
  VVar9.min_bit_width_ = alignment;
  VVar9.type_ = TVar2;
  VVar9.field_0.i_ = (long)local_58 - (long)local_40;
  return VVar9;
}

Assistant:

Value CreateVector(size_t start, size_t vec_len, size_t step, bool typed,
                     bool fixed, const Value *keys = nullptr) {
    FLATBUFFERS_ASSERT(
        !fixed ||
        typed);  // typed=false, fixed=true combination is not supported.
    // Figure out smallest bit width we can store this vector with.
    auto bit_width = (std::max)(force_min_bit_width_, WidthU(vec_len));
    auto prefix_elems = 1;
    if (keys) {
      // If this vector is part of a map, we will pre-fix an offset to the keys
      // to this vector.
      bit_width = (std::max)(bit_width, keys->ElemWidth(buf_.size(), 0));
      prefix_elems += 2;
    }
    Type vector_type = FBT_KEY;
    // Check bit widths and types for all elements.
    for (size_t i = start; i < stack_.size(); i += step) {
      auto elem_width =
          stack_[i].ElemWidth(buf_.size(), i - start + prefix_elems);
      bit_width = (std::max)(bit_width, elem_width);
      if (typed) {
        if (i == start) {
          vector_type = stack_[i].type_;
        } else {
          // If you get this assert, you are writing a typed vector with
          // elements that are not all the same type.
          FLATBUFFERS_ASSERT(vector_type == stack_[i].type_);
        }
      }
    }
    // If you get this assert, your typed types are not one of:
    // Int / UInt / Float / Key.
    FLATBUFFERS_ASSERT(!typed || IsTypedVectorElementType(vector_type));
    auto byte_width = Align(bit_width);
    // Write vector. First the keys width/offset if available, and size.
    if (keys) {
      WriteOffset(keys->u_, byte_width);
      Write<uint64_t>(1ULL << keys->min_bit_width_, byte_width);
    }
    if (!fixed) Write<uint64_t>(vec_len, byte_width);
    // Then the actual data.
    auto vloc = buf_.size();
    for (size_t i = start; i < stack_.size(); i += step) {
      WriteAny(stack_[i], byte_width);
    }
    // Then the types.
    if (!typed) {
      for (size_t i = start; i < stack_.size(); i += step) {
        buf_.push_back(stack_[i].StoredPackedType(bit_width));
      }
    }
    return Value(static_cast<uint64_t>(vloc),
                 keys ? FBT_MAP
                      : (typed ? ToTypedVector(vector_type, fixed ? vec_len : 0)
                               : FBT_VECTOR),
                 bit_width);
  }